

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

optional<tinyusdz::Interpolation> *
tinyusdz::InterpolationFromString
          (optional<tinyusdz::Interpolation> *__return_storage_ptr__,string *v)

{
  int iVar1;
  
  iVar1 = ::std::__cxx11::string::compare((char *)v);
  if (iVar1 == 0) {
    __return_storage_ptr__->has_value_ = true;
    __return_storage_ptr__->contained = (storage_t<tinyusdz::Interpolation>)0x4;
    return __return_storage_ptr__;
  }
  iVar1 = ::std::__cxx11::string::compare((char *)v);
  if (iVar1 == 0) {
    __return_storage_ptr__->has_value_ = true;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)v);
    if (iVar1 == 0) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Interpolation>)0x1;
      return __return_storage_ptr__;
    }
    iVar1 = ::std::__cxx11::string::compare((char *)v);
    if (iVar1 == 0) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Interpolation>)0x3;
      return __return_storage_ptr__;
    }
    iVar1 = ::std::__cxx11::string::compare((char *)v);
    if (iVar1 == 0) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<tinyusdz::Interpolation>)0x2;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->has_value_ = false;
  }
  __return_storage_ptr__->contained = (storage_t<tinyusdz::Interpolation>)0x0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Interpolation> InterpolationFromString(const std::string &v) {
  if ("faceVarying" == v) {
    return Interpolation::FaceVarying;
  } else if ("constant" == v) {
    return Interpolation::Constant;
  } else if ("uniform" == v) {
    return Interpolation::Uniform;
  } else if ("vertex" == v) {
    return Interpolation::Vertex;
  } else if ("varying" == v) {
    return Interpolation::Varying;
  }
  return nonstd::nullopt;
}